

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O3

void __thiscall
BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
::copy_tree(BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
            *this,BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *other)

{
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  **ppBVar1;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *pBVar2;
  size_t sVar3;
  
  b_array::copy_array<Map::Pair<std::__cxx11::string,MultiMap::MultiMap<std::__cxx11::string,long>>>
            (&other->data,&this->data,other->data_size,&this->data_size);
  this->duplicates_allowed = other->duplicates_allowed;
  sVar3 = other->subset_size;
  this->subset_size = sVar3;
  if (sVar3 != 0) {
    sVar3 = 0;
    do {
      ppBVar1 = b_array::
                Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_*>
                ::operator[](&other->subset,sVar3);
      if (*ppBVar1 !=
          (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           *)0x0) {
        pBVar2 = (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)operator_new(0x40);
        BPlusTree(pBVar2,other->duplicates_allowed);
        ppBVar1 = b_array::
                  Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_*>
                  ::operator[](&this->subset,sVar3);
        *ppBVar1 = pBVar2;
        ppBVar1 = b_array::
                  Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_*>
                  ::operator[](&this->subset,sVar3);
        pBVar2 = *ppBVar1;
        ppBVar1 = b_array::
                  Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_*>
                  ::operator[](&other->subset,sVar3);
        copy_tree(pBVar2,*ppBVar1);
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 < other->subset_size);
  }
  return;
}

Assistant:

void BPlusTree<T>::copy_tree(const BPlusTree<T>& other) {
    // copy data
    b_array::copy_array(other.data, data, other.data_size, data_size);
    duplicates_allowed = other.duplicates_allowed;
    subset_size = other.subset_size;
    for (size_t i = 0; i < other.subset_size; ++i) {
        if (other.subset[i] != nullptr) {
            subset[i] = new BPlusTree<T>(other.duplicates_allowed);
            subset[i]->copy_tree(*(other.subset[i]));
        }
    }
}